

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::form::iterator::iterator(iterator *this,iterator *other)

{
  _data *p_Var1;
  
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this,
             (deque<unsigned_int,_std::allocator<unsigned_int>_> *)other);
  this->current_ = other->current_;
  this->offset_ = other->offset_;
  if ((other->d).ptr_ == (_data *)0x0) {
    p_Var1 = (_data *)0x0;
  }
  else {
    p_Var1 = (_data *)operator_new(1);
  }
  (this->d).ptr_ = p_Var1;
  return;
}

Assistant:

form::iterator::iterator(form::iterator const &other) : 
	return_positions_(other.return_positions_),
	current_(other.current_),
	offset_(other.offset_),
	d(other.d)
{
}